

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::UnescapeCEscapeSequences
              (char *source,char *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  char *hex_start;
  uint ch_1;
  char ch;
  char *p;
  char *d;
  int local_88;
  char local_81;
  char *local_80;
  char *local_78;
  int local_4;
  
  local_80 = in_RDI;
  local_78 = in_RSI;
  while( true ) {
    bVar4 = false;
    if ((local_80 == local_78) && (bVar4 = false, *local_80 != '\0')) {
      bVar4 = *local_80 != '\\';
    }
    if (!bVar4) break;
    local_80 = local_80 + 1;
    local_78 = local_78 + 1;
  }
  while( true ) {
    if (*local_80 == '\0') break;
    if (*local_80 == '\\') {
      pcVar3 = local_80 + 1;
      switch(local_80[1]) {
      case '\0':
        *local_78 = '\0';
        goto LAB_00415cd5;
      default:
        break;
      case '\"':
        *local_78 = '\"';
        local_78 = local_78 + 1;
        break;
      case '\'':
        *local_78 = '\'';
        local_78 = local_78 + 1;
        break;
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
        local_81 = *pcVar3 + -0x30;
        if (('/' < local_80[2]) && (local_80[2] < '8')) {
          local_81 = local_81 * '\b' + local_80[2] + -0x30;
          pcVar3 = local_80 + 2;
        }
        local_80 = pcVar3;
        if (('/' < local_80[1]) && (local_80[1] < '8')) {
          local_81 = local_81 * '\b' + local_80[1] + -0x30;
          local_80 = local_80 + 1;
        }
        *local_78 = local_81;
        local_78 = local_78 + 1;
        pcVar3 = local_80;
        break;
      case '?':
        *local_78 = '?';
        local_78 = local_78 + 1;
        break;
      case 'X':
      case 'x':
        uVar1 = isxdigit((int)local_80[2]);
        if ((uVar1 & 1) != 0) {
          local_88 = 0;
          local_80 = pcVar3;
          while (uVar1 = isxdigit((int)local_80[1]), (uVar1 & 1) != 0) {
            iVar2 = hex_digit_to_int(local_80[1]);
            local_88 = local_88 * 0x10 + iVar2;
            local_80 = local_80 + 1;
          }
          *local_78 = (char)local_88;
          local_78 = local_78 + 1;
          pcVar3 = local_80;
        }
        break;
      case '\\':
        *local_78 = '\\';
        local_78 = local_78 + 1;
        break;
      case 'a':
        *local_78 = '\a';
        local_78 = local_78 + 1;
        break;
      case 'b':
        *local_78 = '\b';
        local_78 = local_78 + 1;
        break;
      case 'f':
        *local_78 = '\f';
        local_78 = local_78 + 1;
        break;
      case 'n':
        *local_78 = '\n';
        local_78 = local_78 + 1;
        break;
      case 'r':
        *local_78 = '\r';
        local_78 = local_78 + 1;
        break;
      case 't':
        *local_78 = '\t';
        local_78 = local_78 + 1;
        break;
      case 'v':
        *local_78 = '\v';
        local_78 = local_78 + 1;
      }
    }
    else {
      *local_78 = *local_80;
      local_78 = local_78 + 1;
      pcVar3 = local_80;
    }
    local_80 = pcVar3 + 1;
  }
  *local_78 = '\0';
LAB_00415cd5:
  local_4 = (int)local_78 - (int)in_RSI;
  return local_4;
}

Assistant:

int UnescapeCEscapeSequences(const char* source, char* dest,
                             std::vector<string> *errors) {
  GOOGLE_DCHECK(errors == nullptr) << "Error reporting not implemented.";

  char* d = dest;
  const char* p = source;

  // Small optimization for case where source = dest and there's no escaping
  while ( p == d && *p != '\0' && *p != '\\' )
    p++, d++;

  while (*p != '\0') {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      switch ( *++p ) {                    // skip past the '\\'
        case '\0':
          LOG_STRING(ERROR, errors) << "String cannot end with \\";
          *d = '\0';
          return d - dest;   // we're done with p
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0': case '1': case '2': case '3':  // octal digit: 1 to 3 digits
        case '4': case '5': case '6': case '7': {
          char ch = *p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )
            ch = ch * 8 + *++p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )      // safe (and easy) to do this twice
            ch = ch * 8 + *++p - '0';      // now points at last digit
          *d++ = ch;
          break;
        }
        case 'x': case 'X': {
          if (!isxdigit(p[1])) {
            if (p[1] == '\0') {
              LOG_STRING(ERROR, errors) << "String cannot end with \\x";
            } else {
              LOG_STRING(ERROR, errors) <<
                "\\x cannot be followed by non-hex digit: \\" << *p << p[1];
            }
            break;
          }
          unsigned int ch = 0;
          const char *hex_start = p;
          while (isxdigit(p[1]))  // arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF)
            LOG_STRING(ERROR, errors) << "Value of " <<
              "\\" << string(hex_start, p+1-hex_start) << " exceeds 8 bits";
          *d++ = ch;
          break;
        }
#if 0  // TODO(kenton):  Support \u and \U?  Requires runetochar().
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 4; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              LOG_STRING(ERROR, errors)
                << "\\u must be followed by 4 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 8; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              char32 newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                LOG_STRING(ERROR, errors)
                  << "Value of \\"
                  << string(hex_start, p + 1 - hex_start)
                  << " exceeds Unicode limit (0x10FFFF)";
                break;
              } else {
                rune = newrune;
              }
            } else {
              LOG_STRING(ERROR, errors)
                << "\\U must be followed by 8 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
#endif
        default:
          LOG_STRING(ERROR, errors) << "Unknown escape sequence: \\" << *p;
      }
      p++;                                 // read past letter we escaped
    }
  }
  *d = '\0';
  return d - dest;
}